

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O1

void __thiscall QMakeParser::warnOperator(QMakeParser *this,char *msg)

{
  char *pcVar1;
  storage_type *psVar2;
  storage_type *psVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QAnyStringView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QAnyStringView QVar10;
  QArrayData *local_70;
  int local_68;
  QChar local_60;
  QArrayData *local_58 [3];
  QArrayData *local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_invert != 0) {
    QVar4.m_data = (storage_type *)0x16;
    QVar4.m_size = (qsizetype)local_58;
    QString::fromLatin1(QVar4);
    if (msg == (char *)0x0) {
      psVar3 = (storage_type *)0x0;
    }
    else {
      psVar2 = (storage_type *)0xffffffffffffffff;
      do {
        psVar3 = psVar2 + 1;
        pcVar1 = msg + 1 + (long)psVar2;
        psVar2 = psVar3;
      } while (*pcVar1 != '\0');
    }
    QVar5.m_data = psVar3;
    QVar5.m_size = (qsizetype)&local_70;
    QString::fromLatin1(QVar5);
    QVar6.m_size = (size_t)local_58;
    QVar6.field_0.m_data = local_40;
    QString::arg_impl(QVar6,local_68,local_60);
    message(this,0x200,(QString *)local_40);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,0x10);
      }
    }
    if (local_70 != (QArrayData *)0x0) {
      LOCK();
      (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_70,2,0x10);
      }
    }
    if (local_58[0] != (QArrayData *)0x0) {
      LOCK();
      (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58[0],2,0x10);
      }
    }
    this->m_invert = 0;
  }
  if (this->m_operator == OrOperator) {
    QVar8.m_data = (storage_type *)0x15;
    QVar8.m_size = (qsizetype)local_58;
    QString::fromLatin1(QVar8);
    if (msg == (char *)0x0) {
LAB_0028ecee:
      psVar2 = (storage_type *)0x0;
    }
    else {
      psVar3 = (storage_type *)0xffffffffffffffff;
      do {
        psVar2 = psVar3 + 1;
        pcVar1 = msg + 1 + (long)psVar3;
        psVar3 = psVar2;
      } while (*pcVar1 != '\0');
    }
  }
  else {
    if (this->m_operator != AndOperator) goto LAB_0028eda6;
    QVar7.m_data = (storage_type *)0x16;
    QVar7.m_size = (qsizetype)local_58;
    QString::fromLatin1(QVar7);
    if (msg == (char *)0x0) goto LAB_0028ecee;
    psVar3 = (storage_type *)0xffffffffffffffff;
    do {
      psVar2 = psVar3 + 1;
      pcVar1 = msg + 1 + (long)psVar3;
      psVar3 = psVar2;
    } while (*pcVar1 != '\0');
  }
  QVar9.m_data = psVar2;
  QVar9.m_size = (qsizetype)&local_70;
  QString::fromLatin1(QVar9);
  QVar10.m_size = (size_t)local_58;
  QVar10.field_0.m_data = local_40;
  QString::arg_impl(QVar10,local_68,local_60);
  message(this,0x200,(QString *)local_40);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70,2,0x10);
    }
  }
  if (local_58[0] != (QArrayData *)0x0) {
    LOCK();
    (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58[0],2,0x10);
    }
  }
  this->m_operator = NoOperator;
LAB_0028eda6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMakeParser::warnOperator(const char *msg)
{
    if (m_invert) {
        languageWarning(fL1S("Stray NOT operator %1.").arg(fL1S(msg)));
        m_invert = 0;
    }
    if (m_operator == AndOperator) {
        languageWarning(fL1S("Stray AND operator %1.").arg(fL1S(msg)));
        m_operator = NoOperator;
    } else if (m_operator == OrOperator) {
        languageWarning(fL1S("Stray OR operator %1.").arg(fL1S(msg)));
        m_operator = NoOperator;
    }
}